

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  __node_base_ptr *pp_Var1;
  uint *puVar2;
  ulong uVar3;
  int local_a4;
  string s;
  coda_cache<int,_int> cache;
  
  puts("Test 1: check that elements in cache with time_max == 0 do not expire");
  pp_Var1 = &cache.data._M_h._M_single_bucket;
  cache.data._M_h._M_bucket_count = 1;
  cache.data._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  cache.data._M_h._M_element_count = 0;
  cache.data._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  cache.data._M_h._M_rehash_policy._M_next_resize = 0;
  cache.data._M_h._M_single_bucket = (__node_base_ptr)0x0;
  cache.begp = (data_value_t *)0x0;
  cache.endp = (data_value_t *)0x0;
  cache.size_cur = 0;
  cache.size_max = 0x400;
  cache.time_max = 0;
  s._M_dataplus._M_p = (pointer)((ulong)s._M_dataplus._M_p._4_4_ << 0x20);
  local_a4 = 0x17;
  cache.data._M_h._M_buckets = pp_Var1;
  coda_cache<int,_int>::set(&cache,(int *)&s,&local_a4,false);
  s._M_dataplus._M_p = s._M_dataplus._M_p & 0xffffffff00000000;
  puVar2 = (uint *)coda_cache<int,_int>::get(&cache,(int *)&s);
  if (puVar2 == (uint *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = (ulong)*puVar2;
  }
  printf("right after insert got %d\n",uVar3);
  sleep(1);
  s._M_dataplus._M_p = s._M_dataplus._M_p & 0xffffffff00000000;
  puVar2 = (uint *)coda_cache<int,_int>::get(&cache,(int *)&s);
  if (puVar2 == (uint *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = (ulong)*puVar2;
  }
  printf("one second later got %d\n",uVar3);
  sleep(3);
  s._M_dataplus._M_p = s._M_dataplus._M_p & 0xffffffff00000000;
  puVar2 = (uint *)coda_cache<int,_int>::get(&cache,(int *)&s);
  if (puVar2 == (uint *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = (ulong)*puVar2;
  }
  printf("three more seconds later got %d\n",uVar3);
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  s._M_dataplus._M_p = (pointer)&s.field_2;
  coda_cache<int,_int>::dbg(&cache,&s,1);
  printf("dbg: %s\n",s._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&s);
  std::
  _Hashtable<int,_std::pair<const_int,_coda_cache<int,_int>::elem_t>,_std::allocator<std::pair<const_int,_coda_cache<int,_int>::elem_t>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_coda_cache<int,_int>::elem_t>,_std::allocator<std::pair<const_int,_coda_cache<int,_int>::elem_t>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&cache);
  puts("Test 2: check that elements in cache with time_max = 1 expire after one second");
  cache.data._M_h._M_bucket_count = 1;
  cache.data._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  cache.data._M_h._M_element_count = 0;
  cache.data._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  cache.data._M_h._M_rehash_policy._M_next_resize = 0;
  cache.data._M_h._M_single_bucket = (__node_base_ptr)0x0;
  cache.size_cur = 0;
  cache.begp = (data_value_t *)0x0;
  cache.endp = (data_value_t *)0x0;
  s._M_dataplus._M_p = s._M_dataplus._M_p & 0xffffffff00000000;
  cache.size_max = 0x400;
  cache.time_max = 1;
  local_a4 = 0x23;
  cache.data._M_h._M_buckets = pp_Var1;
  coda_cache<int,_int>::set(&cache,(int *)&s,&local_a4,false);
  s._M_dataplus._M_p = s._M_dataplus._M_p & 0xffffffff00000000;
  puVar2 = (uint *)coda_cache<int,_int>::get(&cache,(int *)&s);
  if (puVar2 == (uint *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = (ulong)*puVar2;
  }
  printf("right after insert got %d\n",uVar3);
  sleep(1);
  s._M_dataplus._M_p = s._M_dataplus._M_p & 0xffffffff00000000;
  puVar2 = (uint *)coda_cache<int,_int>::get(&cache,(int *)&s);
  if (puVar2 == (uint *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = (ulong)*puVar2;
  }
  printf("one second later got %d\n",uVar3);
  sleep(3);
  s._M_dataplus._M_p = s._M_dataplus._M_p & 0xffffffff00000000;
  puVar2 = (uint *)coda_cache<int,_int>::get(&cache,(int *)&s);
  if (puVar2 == (uint *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = (ulong)*puVar2;
  }
  printf("three more seconds later got %d\n",uVar3);
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  s._M_dataplus._M_p = (pointer)&s.field_2;
  coda_cache<int,_int>::dbg(&cache,&s,1);
  printf("dbg: %s\n",s._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&s);
  std::
  _Hashtable<int,_std::pair<const_int,_coda_cache<int,_int>::elem_t>,_std::allocator<std::pair<const_int,_coda_cache<int,_int>::elem_t>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_coda_cache<int,_int>::elem_t>,_std::allocator<std::pair<const_int,_coda_cache<int,_int>::elem_t>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&cache);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
	/* TEST 1 */
	{
		printf("Test 1: check that elements in cache with time_max == 0 do not expire\n");

		coda_cache<int, int> cache (1024, 0);
		cache.set(0, 23, false);
		const int *v = cache.get(0);
		printf("right after insert got %d\n", (int) (v ? *v : 0));

		sleep(1);
		v = cache.get(0);
		printf("one second later got %d\n", (int) (v ? *v : 0));

		sleep(3);
		v = cache.get(0);
		printf("three more seconds later got %d\n", (int) (v ? *v : 0));

		std::string s;
		cache.dbg(s, 1);
		printf("dbg: %s\n", s.c_str());
	}

	/* TEST 2 */
	{
		printf("Test 2: check that elements in cache with time_max = 1 expire after one second\n");

		coda_cache<int, int> cache (1024, 1);
		cache.set(0, 35, false);
		const int *v = cache.get(0);
		printf("right after insert got %d\n", (int) (v ? *v : 0));

		sleep(1);
		v = cache.get(0);
		printf("one second later got %d\n", (int) (v ? *v : 0));

		sleep(3);
		v = cache.get(0);
		printf("three more seconds later got %d\n", (int) (v ? *v : 0));

		std::string s;
		cache.dbg(s, 1);
		printf("dbg: %s\n", s.c_str());
	}

#if 0
	coda_cache<int, int> cache (1024 * 1024, 86400);

	cache.set(0, 23, false);
	cache.set(1, 32, true);

	std::string dbg;
	cache.dbg(dbg, 1);

	printf("%s\n", dbg.c_str());

#if 1
	// std::vector<long double> v (5);
	std::string v = "12345";

	printf("%u\n", (unsigned) estimate_capacity(v));

	printf("sizeof(std::string)=%u\n", (unsigned) sizeof(std::string));
	printf("sizeof(std::vector<int>)=%u\n", (unsigned) sizeof(std::vector<int>));
	printf("sizeof(std::map<std::string,custom_type>)=%u\n", (unsigned) sizeof(std::map<std::string,custom_type>));
	printf("sizeof(std::map<std::string,custom_type>::value_type)=%u\n", (unsigned) sizeof(std::map<std::string,custom_type>::value_type));
	printf("sizeof(std::pair<std::string,custom_type>)=%u\n", (unsigned) sizeof(std::pair<std::string,custom_type>));
#endif
#endif

	return 0;
}